

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

void wallet::CachedTxGetAmounts
               (CWallet *wallet,CWalletTx *wtx,
               list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *listReceived,
               list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *listSent,
               CAmount *nFee,isminefilter *filter,bool include_change)

{
  bool bVar1;
  undefined1 uVar2;
  isminetype iVar3;
  CAmount CVar4;
  CAmount CVar5;
  ulong uVar6;
  size_type sVar7;
  value_type *in_RDI;
  long *in_R8;
  ConstevalFormatString<1U> in_R9;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  isminetype fIsMine;
  CTxOut *txout;
  uint i;
  CAmount nValueOut;
  CAmount nDebit;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  COutputEntry output;
  CTxDestination address;
  CWalletTx *in_stack_fffffffffffffe48;
  value_type *in_stack_fffffffffffffe50;
  CWallet *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  CWallet *in_stack_fffffffffffffe68;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *this;
  undefined2 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe72;
  undefined1 in_stack_fffffffffffffe73;
  undefined4 in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  CTransaction *in_stack_fffffffffffffe80;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  uint local_154;
  CTxDestination *in_stack_ffffffffffffff30;
  CScript *in_stack_ffffffffffffff38;
  undefined1 local_98 [64];
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_R8 = 0;
  std::__cxx11::list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::clear
            ((list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *)
             in_stack_fffffffffffffe48);
  std::__cxx11::list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::clear
            ((list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *)
             in_stack_fffffffffffffe48);
  CVar4 = CachedTxGetDebit(in_stack_fffffffffffffe68,
                           (CWalletTx *)
                           CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                           (isminefilter *)in_stack_fffffffffffffe58);
  if (0 < CVar4) {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe48);
    CVar5 = CTransaction::GetValueOut(in_stack_fffffffffffffe80);
    *in_R8 = CVar4 - CVar5;
  }
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffe88,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78,
             (char *)CONCAT44(in_stack_fffffffffffffe74,
                              CONCAT13(in_stack_fffffffffffffe73,
                                       CONCAT12(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)
                                      )),(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe68 >> 0x18,0));
  local_154 = 0;
  do {
    uVar6 = (ulong)local_154;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe48);
    sVar7 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe48);
    if (sVar7 <= uVar6) {
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe48);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe48);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe58,
               (size_type)in_stack_fffffffffffffe50);
    iVar3 = CWallet::IsMine(in_stack_fffffffffffffe58,(CTxOut *)in_stack_fffffffffffffe50);
    if (CVar4 < 1) {
      if ((iVar3 & *(isminetype *)in_R9.fmt) != ISMINE_NO) goto LAB_015aed73;
    }
    else if (((in_stack_00000008 & 1) != 0) ||
            (bVar1 = OutputIsChange(in_stack_fffffffffffffe58,(CTxOut *)in_stack_fffffffffffffe50),
            !bVar1)) {
LAB_015aed73:
      this = &local_58;
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)in_stack_fffffffffffffe48);
      bVar1 = ExtractDestination(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      if ((!bVar1) &&
         (uVar2 = CScript::IsUnspendable((CScript *)in_stack_fffffffffffffe50), !(bool)uVar2)) {
        in_stack_fffffffffffffe50 = in_RDI;
        in_stack_fffffffffffffe58 = (CWallet *)CWalletTx::GetHash(in_stack_fffffffffffffe48);
        transaction_identifier<false>::ToString_abi_cxx11_
                  ((transaction_identifier<false> *)in_stack_fffffffffffffe50);
        CWallet::WalletLogPrintf<std::__cxx11::string>
                  ((CWallet *)CONCAT44(iVar3,in_stack_fffffffffffffe98),in_R9,
                   in_stack_fffffffffffffe90);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe48);
        memset(local_98,0,0x20);
        CNoDestination::CNoDestination((CNoDestination *)in_stack_fffffffffffffe48);
        std::
        variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
        ::operator=(this,(CNoDestination *)CONCAT17(uVar2,in_stack_fffffffffffffe60));
        CNoDestination::~CNoDestination((CNoDestination *)in_stack_fffffffffffffe48);
      }
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)in_stack_fffffffffffffe48,
                (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 *)0x15aeeca);
      if (0 < CVar4) {
        std::__cxx11::list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::push_back
                  ((list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *)
                   in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      }
      if ((iVar3 & *(isminetype *)in_R9.fmt) != ISMINE_NO) {
        std::__cxx11::list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_>::push_back
                  ((list<wallet::COutputEntry,_std::allocator<wallet::COutputEntry>_> *)
                   in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      }
      COutputEntry::~COutputEntry((COutputEntry *)in_stack_fffffffffffffe48);
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)in_stack_fffffffffffffe48);
    }
    local_154 = local_154 + 1;
  } while( true );
}

Assistant:

void CachedTxGetAmounts(const CWallet& wallet, const CWalletTx& wtx,
                  std::list<COutputEntry>& listReceived,
                  std::list<COutputEntry>& listSent, CAmount& nFee, const isminefilter& filter,
                  bool include_change)
{
    nFee = 0;
    listReceived.clear();
    listSent.clear();

    // Compute fee:
    CAmount nDebit = CachedTxGetDebit(wallet, wtx, filter);
    if (nDebit > 0) // debit>0 means we signed/sent this transaction
    {
        CAmount nValueOut = wtx.tx->GetValueOut();
        nFee = nDebit - nValueOut;
    }

    LOCK(wallet.cs_wallet);
    // Sent/received.
    for (unsigned int i = 0; i < wtx.tx->vout.size(); ++i)
    {
        const CTxOut& txout = wtx.tx->vout[i];
        isminetype fIsMine = wallet.IsMine(txout);
        // Only need to handle txouts if AT LEAST one of these is true:
        //   1) they debit from us (sent)
        //   2) the output is to us (received)
        if (nDebit > 0)
        {
            if (!include_change && OutputIsChange(wallet, txout))
                continue;
        }
        else if (!(fIsMine & filter))
            continue;

        // In either case, we need to get the destination address
        CTxDestination address;

        if (!ExtractDestination(txout.scriptPubKey, address) && !txout.scriptPubKey.IsUnspendable())
        {
            wallet.WalletLogPrintf("CWalletTx::GetAmounts: Unknown transaction type found, txid %s\n",
                                    wtx.GetHash().ToString());
            address = CNoDestination();
        }

        COutputEntry output = {address, txout.nValue, (int)i};

        // If we are debited by the transaction, add the output as a "sent" entry
        if (nDebit > 0)
            listSent.push_back(output);

        // If we are receiving the output, add it as a "received" entry
        if (fIsMine & filter)
            listReceived.push_back(output);
    }

}